

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.c
# Opt level: O0

int showmatch(int f,int n)

{
  int iVar1;
  int local_18;
  int s;
  int i;
  int n_local;
  int f_local;
  
  local_18 = 0;
  while( true ) {
    if (n <= local_18) {
      return 1;
    }
    iVar1 = selfinsert(8,1);
    if (iVar1 != 1) break;
    iVar1 = balance();
    if (iVar1 != 1) {
      dobeep();
    }
    local_18 = local_18 + 1;
  }
  return iVar1;
}

Assistant:

int
showmatch(int f, int n)
{
	int	i, s;

	for (i = 0; i < n; i++) {
		if ((s = selfinsert(FFRAND, 1)) != TRUE)
			return (s);
		/* unbalanced -- warn user */
		if (balance() != TRUE)
			dobeep();
	}
	return (TRUE);
}